

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoration_manager.cpp
# Opt level: O2

void __thiscall
spvtools::opt::analysis::DecorationManager::CloneDecorations
          (DecorationManager *this,uint32_t from,uint32_t to,
          vector<spv::Decoration,_std::allocator<spv::Decoration>_> *decorations_to_copy)

{
  Op OVar1;
  pointer pDVar2;
  pointer pDVar3;
  DecorationManager *pDVar4;
  uint32_t from_00;
  __normal_iterator<const_spv::Decoration_*,_std::vector<spv::Decoration,_std::allocator<spv::Decoration>_>_>
  _Var5;
  Instruction *pIVar6;
  pointer ppIVar7;
  undefined8 *puVar8;
  initializer_list<unsigned_int> init_list;
  uint32_t local_84;
  DecorationManager *local_80;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
  local_78;
  IRContext *local_70;
  undefined8 *local_68;
  uint32_t from_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  indirect_decorations;
  
  from_local = from;
  local_78._M_cur =
       (__node_type *)
       std::
       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
       ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)this,&from_local);
  if (local_78._M_cur != (__node_type *)0x0) {
    local_70 = this->module_->context_;
    local_68 = *(undefined8 **)((long)local_78._M_cur + 0x18);
    local_80 = this;
    for (puVar8 = *(undefined8 **)((long)local_78._M_cur + 0x10); puVar8 != local_68;
        puVar8 = puVar8 + 1) {
      pIVar6 = (Instruction *)*puVar8;
      pDVar2 = (decorations_to_copy->
               super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pDVar3 = (decorations_to_copy->
               super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      indirect_decorations.
      super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           Instruction::GetSingleWordInOperand(pIVar6,1);
      _Var5 = std::
              __find_if<__gnu_cxx::__normal_iterator<spv::Decoration_const*,std::vector<spv::Decoration,std::allocator<spv::Decoration>>>,__gnu_cxx::__ops::_Iter_equals_val<spv::Decoration_const>>
                        (pDVar2,pDVar3,(SmallVector<unsigned_int,_2UL> *)&indirect_decorations);
      pDVar4 = local_80;
      if (_Var5._M_current !=
          (decorations_to_copy->
          super__Vector_base<spv::Decoration,_std::allocator<spv::Decoration>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar6 = Instruction::Clone(pIVar6,local_80->module_->context_);
        init_list._M_len = 1;
        init_list._M_array = &local_84;
        local_84 = to;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&indirect_decorations,init_list);
        Instruction::SetInOperand(pIVar6,0,(SmallVector<unsigned_int,_2UL> *)&indirect_decorations);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)&indirect_decorations);
        utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                  (&pIVar6->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
                   &(pDVar4->module_->annotations_).super_IntrusiveList<spvtools::opt::Instruction>.
                    sentinel_);
        IRContext::AnalyzeUses
                  (local_70,(pDVar4->module_->annotations_).
                            super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                            super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
      }
    }
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              (&indirect_decorations,
               (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)((long)&((local_78._M_cur)->
                          super__Hash_node_value<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>,_false>
                          ).
                          super__Hash_node_value_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::DecorationManager::TargetData>_>
                          ._M_storage._M_storage + 0x20));
    pDVar4 = local_80;
    for (ppIVar7 = (pointer)CONCAT44(indirect_decorations.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint32_t)
                                     indirect_decorations.
                                     super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        ppIVar7 !=
        indirect_decorations.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppIVar7 = ppIVar7 + 1) {
      OVar1 = (*ppIVar7)->opcode_;
      if (OVar1 != OpGroupDecorate) {
        if (OVar1 == OpGroupMemberDecorate) {
          __assert_fail("false && \"The source id is not suppose to be a type.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                        ,0x252,
                        "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t, const std::vector<spv::Decoration> &)"
                       );
        }
        __assert_fail("false && \"Unexpected decoration instruction\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/decoration_manager.cpp"
                      ,0x256,
                      "void spvtools::opt::analysis::DecorationManager::CloneDecorations(uint32_t, uint32_t, const std::vector<spv::Decoration> &)"
                     );
      }
      from_00 = Instruction::GetSingleWordInOperand(*ppIVar7,0);
      CloneDecorations(pDVar4,from_00,to,decorations_to_copy);
    }
    std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~_Vector_base(&indirect_decorations.
                   super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 );
  }
  return;
}

Assistant:

void DecorationManager::CloneDecorations(
    uint32_t from, uint32_t to,
    const std::vector<spv::Decoration>& decorations_to_copy) {
  const auto decoration_list = id_to_decoration_insts_.find(from);
  if (decoration_list == id_to_decoration_insts_.end()) return;
  auto context = module_->context();
  for (Instruction* inst : decoration_list->second.direct_decorations) {
    if (std::find(decorations_to_copy.begin(), decorations_to_copy.end(),
                  spv::Decoration(inst->GetSingleWordInOperand(1))) ==
        decorations_to_copy.end()) {
      continue;
    }

    // Clone decoration and change |target-id| to |to|.
    std::unique_ptr<Instruction> new_inst(inst->Clone(module_->context()));
    new_inst->SetInOperand(0, {to});
    module_->AddAnnotationInst(std::move(new_inst));
    auto decoration_iter = --module_->annotation_end();
    context->AnalyzeUses(&*decoration_iter);
  }

  // We need to copy the list of instructions as ForgetUses and AnalyzeUses are
  // going to modify it.
  std::vector<Instruction*> indirect_decorations =
      decoration_list->second.indirect_decorations;
  for (Instruction* inst : indirect_decorations) {
    switch (inst->opcode()) {
      case spv::Op::OpGroupDecorate:
        CloneDecorations(inst->GetSingleWordInOperand(0), to,
                         decorations_to_copy);
        break;
      case spv::Op::OpGroupMemberDecorate: {
        assert(false && "The source id is not suppose to be a type.");
        break;
      }
      default:
        assert(false && "Unexpected decoration instruction");
    }
  }
}